

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::MultiNode<QString,QDBusConnectionPrivate::SignalHook>::
insertMulti<QDBusConnectionPrivate::SignalHook_const&>
          (MultiNode<QString,_QDBusConnectionPrivate::SignalHook> *this,SignalHook *args)

{
  long lVar1;
  SignalHook *this_00;
  MultiNodeChain<QDBusConnectionPrivate::SignalHook> *pMVar2;
  long in_FS_OFFSET;
  Chain *e;
  SignalHook *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (SignalHook *)operator_new(0xc0);
  QDBusConnectionPrivate::SignalHook::SignalHook(this_00,in_stack_ffffffffffffffc8);
  this_00[1].service.d.d = (Data *)0x0;
  pMVar2 = std::
           exchange<QHashPrivate::MultiNodeChain<QDBusConnectionPrivate::SignalHook>*,QHashPrivate::MultiNodeChain<QDBusConnectionPrivate::SignalHook>*&>
                     ((MultiNodeChain<QDBusConnectionPrivate::SignalHook> **)this_00,
                      (MultiNodeChain<QDBusConnectionPrivate::SignalHook> **)
                      in_stack_ffffffffffffffc8);
  this_00[1].service.d.d = (Data *)pMVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insertMulti(Args &&... args)
    {
        Chain *e = new Chain{ T(std::forward<Args>(args)...), nullptr };
        e->next = std::exchange(value, e);
    }